

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

sx__job * sx__new_job(sx_job_context *ctx,int index,sx_job_cb *callback,void *user,int range_start,
                     int range_end,sx_job_t counter,uint32_t tags,sx_job_priority priority)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  sx__job *psVar5;
  sx_fiber_t pvVar6;
  sx_fiber_stack stack;
  sx__job *j;
  int range_end_local;
  int range_start_local;
  void *user_local;
  sx_job_cb *callback_local;
  int index_local;
  sx_job_context *ctx_local;
  
  psVar5 = (sx__job *)sx_pool_new(ctx->job_pool);
  if (psVar5 != (sx__job *)0x0) {
    psVar5->job_index = index;
    psVar5->owner_tid = 0;
    psVar5->tags = tags;
    psVar5->done = 0;
    if (((psVar5->stack_mem).sptr == (void *)0x0) &&
       (_Var4 = sx_fiber_stack_init(&psVar5->stack_mem,ctx->stack_sz), !_Var4)) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x81);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                        0x81,"Out of memory");
      pcVar1 = (code *)swi(3);
      psVar5 = (sx__job *)(*pcVar1)();
      return psVar5;
    }
    uVar2 = (psVar5->stack_mem).sptr;
    uVar3 = (psVar5->stack_mem).ssize;
    stack.ssize = uVar3;
    stack.sptr = (void *)uVar2;
    stack._12_4_ = 0;
    pvVar6 = sx_fiber_create(stack,fiber_fn);
    psVar5->fiber = pvVar6;
    psVar5->counter = counter;
    psVar5->wait_counter = &ctx->dummy_counter;
    psVar5->ctx = ctx;
    psVar5->callback = callback;
    psVar5->user = user;
    psVar5->range_start = range_start;
    psVar5->range_end = range_end;
    psVar5->priority = priority;
    psVar5->prev = (sx__job *)0x0;
    psVar5->next = (sx__job *)0x0;
  }
  return psVar5;
}

Assistant:

static sx__job* sx__new_job(sx_job_context* ctx, int index, sx_job_cb* callback, void* user,
                            int range_start, int range_end, sx_job_t counter, uint32_t tags,
                            sx_job_priority priority)
{
    sx__job* j = (sx__job*)sx_pool_new(ctx->job_pool);

    if (j) {
        j->job_index = index;
        j->owner_tid = 0;
        j->tags = tags;
        j->done = 0;
        if (!j->stack_mem.sptr) {
            // Initialize stack memory
            if (!sx_fiber_stack_init(&j->stack_mem, ctx->stack_sz)) {
                sx_out_of_memory();
                return NULL;
            }
        }
        j->fiber = sx_fiber_create(j->stack_mem, fiber_fn);
        j->counter = counter;
        j->wait_counter = &ctx->dummy_counter;
        j->ctx = ctx;
        j->callback = callback;
        j->user = user;
        j->range_start = range_start;
        j->range_end = range_end;
        j->priority = priority;
        j->next = j->prev = NULL;
    }
    return j;
}